

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *headTarget;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  cmGeneratorExpressionInterpreter local_98;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  iVar3 = std::__cxx11::string::compare((char *)language);
  if (iVar3 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  pcVar1 = this->LocalGenerator;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar2 = (pcVar1->super_cmLocalCommonGenerator).ConfigName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,
             pcVar2 + (pcVar1->super_cmLocalCommonGenerator).ConfigName._M_string_length);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = (language->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_98,(cmLocalGenerator *)pcVar1,&local_118,headTarget,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"COMPILE_FLAGS","");
  pcVar4 = cmSourceFile::GetProperty(source,&local_d8);
  if (pcVar4 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,pcVar4,&local_d8);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,__return_storage_ptr__,psVar5);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"COMPILE_OPTIONS","");
  pcVar4 = cmSourceFile::GetProperty(source,&local_f8);
  if (pcVar4 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,pcVar4,&local_f8);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,(psVar5->_M_dataplus)._M_p,
               (char *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.Language._M_dataplus._M_p != &local_98.Language.field_2) {
    operator_delete(local_98.Language._M_dataplus._M_p,
                    local_98.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.Config._M_dataplus._M_p != &local_98.Config.field_2) {
    operator_delete(local_98.Config._M_dataplus._M_p,
                    local_98.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_98.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&local_98.GeneratorExpression);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, this->LocalGenerator->GetConfigName(),
    this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (const char* cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (const char* coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(coptions, COMPILE_OPTIONS));
  }

  return flags;
}